

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  pointer pMVar1;
  cmCommand *pcVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  mode_t *permissions;
  string *this_00;
  string regex;
  ostringstream e;
  string sStack_1d8;
  string local_1b8;
  ostream local_198;
  
  this_00 = &sStack_1d8;
  switch(this->Doing) {
  case 2:
    if ((arg->_M_string_length == 0) ||
       (bVar3 = cmsys::SystemTools::FileIsFullPath((arg->_M_dataplus)._M_p), bVar3)) {
      std::__cxx11::string::_M_assign((string *)&this->Destination);
    }
    else {
      cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      std::__cxx11::string::assign((char *)&this->Destination);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                     ,"/",arg);
      std::__cxx11::string::append((string *)&this->Destination);
      std::__cxx11::string::~string((string *)&local_198);
    }
    goto LAB_003a5b76;
  case 3:
    if ((arg->_M_string_length == 0) ||
       (bVar3 = cmsys::SystemTools::FileIsFullPath((arg->_M_dataplus)._M_p), bVar3)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,arg);
      return true;
    }
    pcVar5 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
    std::__cxx11::string::string((string *)&local_198,pcVar5,(allocator *)&sStack_1d8);
    std::operator+(&sStack_1d8,"/",arg);
    std::__cxx11::string::append((string *)&local_198);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)&local_198);
    this_00 = (string *)&local_198;
    goto LAB_003a5bd8;
  case 4:
    std::__cxx11::string::string((string *)&sStack_1d8,"/",(allocator *)&local_198);
    cmsys::Glob::PatternToRegex((string *)&local_198,arg,false,false);
    std::__cxx11::string::append((string *)&sStack_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::append((char *)&sStack_1d8);
    MatchRule::MatchRule((MatchRule *)&local_198,&sStack_1d8);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::
    emplace_back<cmFileCopier::MatchRule>(&this->MatchRules,(MatchRule *)&local_198);
    MatchRule::~MatchRule((MatchRule *)&local_198);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar4 = std::operator<<(&local_198,"could not compile PATTERN \"");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\".");
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    }
    else {
      this->Doing = 0;
      this_00 = &sStack_1d8;
    }
LAB_003a5bd8:
    std::__cxx11::string::~string((string *)this_00);
    return true;
  case 5:
    MatchRule::MatchRule((MatchRule *)&local_198,arg);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::
    emplace_back<cmFileCopier::MatchRule>(&this->MatchRules,(MatchRule *)&local_198);
    MatchRule::~MatchRule((MatchRule *)&local_198);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar4 = std::operator<<(&local_198,"could not compile REGEX \"");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\".");
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      return true;
    }
LAB_003a5b76:
    this->Doing = 0;
    return true;
  case 6:
    permissions = &this->FilePermissions;
    break;
  case 7:
    permissions = &this->DirPermissions;
    break;
  case 8:
    permissions = &(this->CurrentMatchRule->Properties).Permissions;
    break;
  default:
    return false;
  }
  bVar3 = CheckPermissions(this,arg,permissions);
  if (!bVar3) {
    this->Doing = 1;
    return true;
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch(this->Doing)
    {
    case DoingFiles:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Files.push_back(arg);
        }
      else
        {
        std::string file = this->Makefile->GetCurrentSourceDirectory();
        file += "/" + arg;
        this->Files.push_back(file);
        }
      break;
    case DoingDestination:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Destination = arg;
        }
      else
        {
        this->Destination = this->Makefile->GetCurrentBinaryDirectory();
        this->Destination += "/" + arg;
        }
      this->Doing = DoingNone;
      break;
    case DoingPattern:
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex = "/";
      regex += cmsys::Glob::PatternToRegex(arg, false);
      regex += "$";
      this->MatchRules.push_back(MatchRule(regex));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      }
      break;
    case DoingRegex:
      this->MatchRules.push_back(MatchRule(arg));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsFile:
      if(!this->CheckPermissions(arg, this->FilePermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsDir:
      if(!this->CheckPermissions(arg, this->DirPermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsMatch:
      if(!this->CheckPermissions(
           arg, this->CurrentMatchRule->Properties.Permissions))
        {
        this->Doing = DoingError;
        }
      break;
    default:
      return false;
    }
  return true;
}